

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_container_get_range(bitset_container_t *bitset,uint32_t pos_start,uint32_t pos_end)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  _Bool _Var7;
  
  uVar4 = pos_start >> 6;
  uVar6 = -1L << ((byte)pos_start & 0x3f);
  uVar2 = -1L << ((byte)pos_end & 0x3f);
  uVar3 = pos_end >> 6;
  puVar1 = bitset->words;
  if (uVar4 == uVar3) {
    _Var7 = (uVar6 & ~(puVar1[uVar4] | uVar2)) == 0;
  }
  else {
    if ((puVar1[uVar4] < uVar6) ||
       ((pos_end < 0x10000 && ((uVar2 | puVar1[uVar3]) != 0xffffffffffffffff)))) {
      return false;
    }
    do {
      uVar5 = uVar4 + 1;
      uVar4 = uVar5 & 0xffff;
      _Var7 = uVar3 <= uVar4 || 0x3ff < (ushort)uVar5;
      if (_Var7) {
        return _Var7;
      }
    } while (puVar1[uVar4] == 0xffffffffffffffff);
  }
  return _Var7;
}

Assistant:

static inline bool bitset_container_get_range(const bitset_container_t *bitset,
                                                uint32_t pos_start, uint32_t pos_end) {

    const uint32_t start = pos_start >> 6;
    const uint32_t end = pos_end >> 6;

    const uint64_t first = ~((1ULL << (pos_start & 0x3F)) - 1);
    const uint64_t last = (1ULL << (pos_end & 0x3F)) - 1;

    if (start == end) return ((bitset->words[end] & first & last) == (first & last));
    if ((bitset->words[start] & first) != first) return false;

    if ((end < BITSET_CONTAINER_SIZE_IN_WORDS) && ((bitset->words[end] & last) != last)){

        return false;
    }

    for (uint16_t i = start + 1; (i < BITSET_CONTAINER_SIZE_IN_WORDS) && (i < end); ++i){

        if (bitset->words[i] != UINT64_C(0xFFFFFFFFFFFFFFFF)) return false;
    }

    return true;
}